

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image-write.h
# Opt level: O3

void stbiw__jpg_writeBits(stbi__write_context *s,int *bitBufP,int *bitCntP,unsigned_short *bs)

{
  bool bVar1;
  uint uVar2;
  uint in_R8D;
  int iVar3;
  int iVar4;
  undefined1 local_3a;
  undefined1 local_39;
  int *local_38;
  
  iVar3 = (in_R8D & 0xffff) + *bitCntP;
  uVar2 = ((uint)bs & 0xffff) << (0x18U - (char)iVar3 & 0x1f) | *bitBufP;
  local_38 = bitCntP;
  if (7 < iVar3) {
    iVar4 = iVar3;
    do {
      local_3a = (undefined1)(uVar2 >> 0x10);
      (*s->func)(s->context,&local_3a,1);
      if ((~uVar2 & 0xff0000) == 0) {
        local_39 = 0;
        (*s->func)(s->context,&local_39,1);
      }
      uVar2 = uVar2 << 8;
      iVar3 = iVar4 + -8;
      bVar1 = 0xf < iVar4;
      iVar4 = iVar3;
    } while (bVar1);
  }
  *bitBufP = uVar2;
  *local_38 = iVar3;
  return;
}

Assistant:

static void stbiw__jpg_writeBits(stbi__write_context *s, int *bitBufP, int *bitCntP, const unsigned short *bs) {
   int bitBuf = *bitBufP, bitCnt = *bitCntP;
   bitCnt += bs[1];
   bitBuf |= bs[0] << (24 - bitCnt);
   while(bitCnt >= 8) {
      unsigned char c = (bitBuf >> 16) & 255;
      stbiw__putc(s, c);
      if(c == 255) {
         stbiw__putc(s, 0);
      }
      bitBuf <<= 8;
      bitCnt -= 8;
   }
   *bitBufP = bitBuf;
   *bitCntP = bitCnt;
}